

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isPossibleDataType(TokenKind kind)

{
  int iVar1;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,kind);
  if (iVar1 < 0x113) {
    if (iVar1 < 0xc5) {
      if ((((iVar1 - 0x6dU < 0x36) &&
           ((0x30000000010421U >> ((ulong)(iVar1 - 0x6dU) & 0x3f) & 1) != 0)) || (iVar1 == 2)) ||
         (iVar1 == 0xf)) {
        return true;
      }
    }
    else if ((iVar1 - 0xc5U < 0x3d) &&
            ((0x160000000000c003U >> ((ulong)(iVar1 - 0xc5U) & 0x3f) & 1) != 0)) {
      return true;
    }
  }
  else {
    if ((iVar1 - 0x116U < 0x40) &&
       ((0x8001809400400881U >> ((ulong)(iVar1 - 0x116U) & 0x3f) & 1) != 0)) {
      return true;
    }
    if (iVar1 - 0x113U < 2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool SyntaxFacts::isPossibleDataType(TokenKind kind) {
    switch (kind) {
        case TokenKind::BitKeyword:
        case TokenKind::LogicKeyword:
        case TokenKind::RegKeyword:
        case TokenKind::ByteKeyword:
        case TokenKind::ShortIntKeyword:
        case TokenKind::IntKeyword:
        case TokenKind::LongIntKeyword:
        case TokenKind::IntegerKeyword:
        case TokenKind::TimeKeyword:
        case TokenKind::ShortRealKeyword:
        case TokenKind::RealKeyword:
        case TokenKind::RealTimeKeyword:
        case TokenKind::StringKeyword:
        case TokenKind::ConstKeyword:
        case TokenKind::SignedKeyword:
        case TokenKind::UnsignedKeyword:
        case TokenKind::StructKeyword:
        case TokenKind::UnionKeyword:
        case TokenKind::EnumKeyword:
        case TokenKind::CHandleKeyword:
        case TokenKind::VirtualKeyword:
        case TokenKind::EventKeyword:
        case TokenKind::TypeKeyword:
        case TokenKind::VoidKeyword:
        case TokenKind::Identifier:
        case TokenKind::UnitSystemName:
        case TokenKind::OpenBracket:
            return true;
        default:
            return false;
    }
}